

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O3

void __thiscall glslang::TLiveTraverser::pushFunction(TLiveTraverser *this,TString *name)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  _List_node_base *p_Var6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  _List_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  
  iVar3 = (*this->intermediate->treeRoot->_vptr_TIntermNode[6])();
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 400))
                    ((long *)CONCAT44(extraout_var,iVar3));
  lVar5 = *(long *)(lVar4 + 8);
  if (*(long *)(lVar4 + 0x10) != lVar5) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      p_Var6 = (_List_node_base *)(**(code **)(**(long **)(lVar5 + uVar8 * 8) + 0x30))();
      if ((p_Var6 != (_List_node_base *)0x0) && (*(int *)&p_Var6[0xb]._M_prev == 5)) {
        this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (*(code *)p_Var6->_M_next[0x1a]._M_prev)(p_Var6);
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (this_00,name);
        if (iVar3 == 0) {
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = p_Var6;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(this->destinations).
                    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          return;
        }
      }
      lVar5 = *(long *)(lVar4 + 8);
      bVar2 = uVar9 < (ulong)(*(long *)(lVar4 + 0x10) - lVar5 >> 3);
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void pushFunction(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpFunction && candidate->getName() == name) {
                destinations.push_back(candidate);
                break;
            }
        }
    }